

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.h
# Opt level: O0

void __thiscall
CDBBatch::Write<unsigned_char,FlatFilePos>(CDBBatch *this,uchar *key,FlatFilePos *value)

{
  long lVar1;
  DataStream *in_RDI;
  long in_FS_OFFSET;
  DataStream *unaff_retaddr;
  CDBBatch *in_stack_00000008;
  undefined1 in_stack_00000030 [16];
  DataStream *other;
  DataStream *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  other = (DataStream *)
          &(in_RDI->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  DataStream::reserve(in_RDI,0x92a871);
  this_00 = (DataStream *)
            &in_RDI[1].vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  DataStream::reserve(in_RDI,0x92a888);
  DataStream::operator<<(this_00,(uchar *)other);
  DataStream::operator<<(this_00,(FlatFilePos *)other);
  Span<const_std::byte>::Span<DataStream>((Span<const_std::byte> *)this_00,other,in_RDI);
  WriteImpl(in_stack_00000008,(Span<const_std::byte>)in_stack_00000030,unaff_retaddr);
  DataStream::clear(in_RDI);
  DataStream::clear(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Write(const K& key, const V& value)
    {
        ssKey.reserve(DBWRAPPER_PREALLOC_KEY_SIZE);
        ssValue.reserve(DBWRAPPER_PREALLOC_VALUE_SIZE);
        ssKey << key;
        ssValue << value;
        WriteImpl(ssKey, ssValue);
        ssKey.clear();
        ssValue.clear();
    }